

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

string * __thiscall
BayesianGameCollaborativeGraphical::SoftPrintSummary_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameCollaborativeGraphical *this)

{
  ostream *poVar1;
  const_reference v;
  uint uVar2;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  BayesianGameBase::SoftPrintSummary_abi_cxx11_(&local_1d8,(BayesianGameBase *)this);
  std::operator<<(local_1a8,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  for (uVar2 = 0; (ulong)uVar2 < this->_m_nrLRFs; uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<(local_1a8,"LRF function ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,":");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(local_1a8,"Agent scope ");
    v = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_agentScopes,(ulong)uVar2);
    PrintTools::SoftPrintVector<Scope>(&local_1d8,v);
    poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(local_1a8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameCollaborativeGraphical::SoftPrintSummary() const
{
    stringstream ss;
    ss << BayesianGameBase::SoftPrintSummary();    
    for(Index e=0; e < _m_nrLRFs; e++)
    {
        ss << "LRF function " << e << ":" << endl;
        ss << "Agent scope " << SoftPrintVector(_m_agentScopes.at(e)) << endl;
        //ss << _m_LRFs.at(e)->SoftPrint();
        ss << endl;
    }
    return(ss.str());
}